

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

uint __thiscall
covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::insert
          (StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *es,bool accept,uint base)

{
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  value_type *pvVar4;
  int *piVar5;
  iterator k;
  reference puVar6;
  uint in_ECX;
  byte in_DL;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  iterator et_1;
  iterator it_2;
  uint ii_1;
  StateEntry *entry;
  iterator it;
  iterator et;
  iterator it_1;
  uint ii;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar7;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  vector<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
  local_50;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
  local_48;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
  local_40;
  uint *local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  int local_24;
  uint local_20;
  byte local_19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  uint local_4;
  
  local_19 = in_DL & 1;
  iVar8 = *(int *)&in_RDI->_M_current;
  local_20 = in_ECX;
  local_18 = in_RSI;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  if (iVar8 < (int)sVar2) {
    while( true ) {
      in_stack_ffffffffffffff7c = *(int *)&in_RDI->_M_current;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
      if ((int)sVar2 <= in_stack_ffffffffffffff7c) break;
      *(int *)&in_RDI->_M_current = *(int *)&in_RDI->_M_current << 1;
    }
    puVar3 = (uint *)realloc(in_RDI[1]._M_current,(long)(*(int *)&in_RDI->_M_current << 1) * 4 + 8);
    in_RDI[1]._M_current = puVar3;
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
  *in_RDI[1]._M_current = (int)sVar2 + 1;
  in_RDI[1]._M_current[1] = (uint)(local_19 & 1);
  local_24 = 0;
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        , bVar1) {
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_30);
    in_RDI[1]._M_current[(ulong)(local_24 + 1) + 1] = *puVar6;
    local_24 = local_24 + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_30);
  }
  local_40.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
       ::find((unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(key_type *)0x20de65)
  ;
  local_48.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
       ::end((unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar1 = boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
          ::operator!=(&local_40,&local_48);
  if (bVar1) {
    pvVar4 = boost::unordered::iterator_detail::
             iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
             ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                          *)0x20de9c);
    local_4 = pvVar4->second;
  }
  else {
    local_50.node_ =
         (node_pointer)
         boost::unordered::
         unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
         ::end((unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    bVar1 = boost::unordered::iterator_detail::
            iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
            ::operator!=(&local_40,&local_50);
    if (bVar1) {
      pvVar4 = boost::unordered::iterator_detail::
               iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
               ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                            *)0x20dedd);
      local_4 = pvVar4->second;
    }
    else {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
      piVar5 = (int *)malloc(sVar2 * 8 + 8);
      std::
      vector<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
      ::push_back(in_stack_ffffffffffffff90,(value_type *)CONCAT44(iVar8,in_stack_ffffffffffffff88))
      ;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
      *piVar5 = (int)sVar2 + 1;
      piVar5[1] = (uint)(local_19 & 1);
      iVar8 = 0;
      k = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      while (bVar1 = __gnu_cxx::operator!=
                               (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78)), bVar1) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&stack0xffffffffffffff98);
        piVar5[(ulong)(iVar8 + 1) + 1] = *puVar6;
        iVar8 = iVar8 + 1;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&stack0xffffffffffffff98);
      }
      uVar7 = local_20;
      puVar3 = (uint *)boost::unordered::
                       unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                       ::operator[]((unordered_map<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                                     *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),k._M_current);
      *puVar3 = uVar7;
      local_4 = local_20;
    }
  }
  return local_4;
}

Assistant:

unsigned int insert(Container & es, bool accept, unsigned int base){
         // Ensure there is enough space in temp for the edges
         if(tempsz < (int) es.size())
         {
           while(tempsz < (int) es.size())
           {
             tempsz *= 2;
           }
           temp = ((StateEntry*) realloc(temp, sizeof(StateEntry) + 
                                         (2*tempsz)*sizeof(unsigned int)));
         }
         // Load the edges into temp.
         temp->sz = es.size() + 1;
         temp->data[0] = accept;
         unsigned int ii=0;
         for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
         {
           temp->data[ii+1] = *it;
           ii++;
         }
         
         // Look for the temporary element in the map.
         typename StateCache::iterator it(cache.find(temp));
         if(it != cache.end())
           return (*it).second;
         // Look for the temporary element in the map.
         if(it != cache.end())
           return (*it).second;
         else 
         {
           StateEntry* entry = ((StateEntry*) malloc(sizeof(StateEntry) + 
                                                     (2*es.size())*sizeof(unsigned int))); 
           entries.push_back(entry);
           entry->sz = es.size() + 1; 
           entry->data[0] = accept;
           unsigned int ii=0;
           for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
           {
             entry->data[ii+1] = *it;
             ii++;
           }
           cache[entry] = base;
           return base;
         }
       }